

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O3

char * __thiscall OSToken::index(OSToken *this,char *__s,int __c)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ObjectFile *pOVar8;
  long *plVar9;
  _Base_ptr p_Var10;
  ObjectFile *this_00;
  iterator iVar11;
  size_type *psVar12;
  undefined7 uVar13;
  char cVar14;
  _Self __tmp;
  pointer __v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> newObjects;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addedFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokenFiles;
  MutexLocker lock;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newSet;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  removedFiles;
  undefined1 local_1a8 [32];
  _Rb_tree_node_base *local_188;
  _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
  local_180;
  string local_150;
  string local_130;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  _Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
  *local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  MutexLocker local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  MutexLocker::MutexLocker(&local_a0,this->tokenMutex);
  uVar13 = (undefined7)((ulong)this >> 8);
  if ((int)__s == 0) {
    if (this->valid == true) {
      bVar4 = Generation::wasUpdated(this->gen);
      if (bVar4) goto LAB_00169a68;
    }
    uVar7 = CONCAT71(uVar13,1);
    softHSMLog(7,"index",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
               ,0x251,"No re-indexing is required");
  }
  else {
LAB_00169a68:
    bVar4 = Directory::refresh(this->tokenDir);
    if ((bVar4) && (this->tokenObject->valid != false)) {
      softHSMLog(7,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x260,"Token %s has changed",(this->tokenPath)._M_dataplus._M_p);
      local_188 = (_Rb_tree_node_base *)CONCAT44(local_188._4_4_,(int)__s);
      Directory::getFiles_abi_cxx11_(&local_b8,this->tokenDir);
      p_Var2 = &local_90._M_impl.super__Rb_tree_header;
      local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      if (local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __v = local_b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (__v->_M_string_length < 8) {
LAB_00169b9e:
            softHSMLog(7,"index",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                       ,0x272,"Ignored file %s",(__v->_M_dataplus)._M_p);
          }
          else {
            std::__cxx11::string::substr((ulong)&local_e8,(ulong)__v);
            iVar5 = std::__cxx11::string::compare((char *)&local_e8);
            if (iVar5 == 0) {
              iVar5 = std::__cxx11::string::compare((char *)__v);
              bVar4 = iVar5 != 0;
            }
            else {
              bVar4 = false;
            }
            if ((_Base_ptr *)local_e8._M_impl._0_8_ !=
                (_Base_ptr *)((long)&local_e8._M_impl.super__Rb_tree_header._M_header + 8U)) {
              operator_delete((void *)local_e8._M_impl._0_8_);
            }
            if (!bVar4) goto LAB_00169b9e;
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_90,__v);
          }
          __v = __v + 1;
        } while (__v != local_b8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_e8._M_impl.super__Rb_tree_header._M_header;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((char)local_188 == '\0') {
        if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
          p_Var10 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            iVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&(this->currentFiles)._M_t,(key_type *)(p_Var10 + 1));
            if ((_Rb_tree_header *)iVar11._M_node ==
                &(this->currentFiles)._M_t._M_impl.super__Rb_tree_header) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var10 + 1));
            }
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
          } while ((_Rb_tree_header *)p_Var10 != p_Var2);
        }
        p_Var10 = (this->currentFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(this->currentFiles)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var10 != p_Var1) {
          do {
            iVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_90,(key_type *)(p_Var10 + 1));
            if ((_Rb_tree_header *)iVar11._M_node == p_Var2) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_60,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var10 + 1));
            }
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
          } while ((_Rb_tree_header *)p_Var10 != p_Var1);
        }
      }
      else {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&local_e8,&local_90);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&(this->currentFiles)._M_t,&local_90);
      softHSMLog(7,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x295,"%d objects were added and %d objects were removed",
                 local_e8._M_impl.super__Rb_tree_header._M_node_count,
                 local_60._M_impl.super__Rb_tree_header._M_node_count);
      softHSMLog(7,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x296,"Current directory set contains %d objects");
      if ((_Rb_tree_header *)local_e8._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_e8._M_impl.super__Rb_tree_header) {
        local_188 = (_Rb_tree_node_base *)&this->objects;
        local_f0 = (_Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
                    *)&this->allObjects;
        p_Var10 = local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          cVar14 = (char)(p_Var10 + 1);
          lVar6 = std::__cxx11::string::rfind(cVar14,0x2e);
          if (lVar6 != -1) {
            std::__cxx11::string::rfind(cVar14,0x2e);
            std::__cxx11::string::substr((ulong)&local_180,(ulong)(p_Var10 + 1));
            iVar5 = std::__cxx11::string::compare((char *)&local_180);
            if ((_Base_ptr *)local_180._M_impl._0_8_ !=
                (_Base_ptr *)((long)&local_180._M_impl.super__Rb_tree_header._M_header + 8U)) {
              operator_delete((void *)local_180._M_impl._0_8_);
            }
            if (iVar5 == 0) {
              local_180._M_impl._0_8_ = (long)&local_180._M_impl.super__Rb_tree_header._M_header + 8
              ;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_180,*(long *)(p_Var10 + 1),
                         (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
              uVar7 = std::__cxx11::string::rfind((char)(string *)&local_180,0x2e);
              std::__cxx11::string::replace
                        ((ulong)&local_180,uVar7,(char *)0xffffffffffffffff,0x1789d6);
              pOVar8 = (ObjectFile *)operator_new(0xb0);
              local_1a8._0_8_ = local_1a8 + 0x10;
              pcVar3 = (this->tokenPath)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1a8,pcVar3,pcVar3 + (this->tokenPath)._M_string_length);
              std::__cxx11::string::append((char *)local_1a8);
              plVar9 = (long *)std::__cxx11::string::_M_append
                                         ((char *)local_1a8,*(ulong *)(p_Var10 + 1));
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_130.field_2._M_allocated_capacity = *psVar12;
                local_130.field_2._8_4_ = (undefined4)plVar9[3];
                local_130.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
              }
              else {
                local_130.field_2._M_allocated_capacity = *psVar12;
                local_130._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_130._M_string_length = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              iVar5 = this->umask;
              local_110[0] = local_100;
              pcVar3 = (this->tokenPath)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_110,pcVar3,pcVar3 + (this->tokenPath)._M_string_length);
              std::__cxx11::string::append((char *)local_110);
              plVar9 = (long *)std::__cxx11::string::_M_append
                                         ((char *)local_110,local_180._M_impl._0_8_);
              local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_150.field_2._M_allocated_capacity = *psVar12;
                local_150.field_2._8_8_ = plVar9[3];
              }
              else {
                local_150.field_2._M_allocated_capacity = *psVar12;
                local_150._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_150._M_string_length = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              ObjectFile::ObjectFile(pOVar8,this,&local_130,iVar5,&local_150,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p != &local_150.field_2) {
                operator_delete(local_150._M_dataplus._M_p);
              }
              if (local_110[0] != local_100) {
                operator_delete(local_110[0]);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p);
              }
              if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                operator_delete((void *)local_1a8._0_8_);
              }
              ObjectFile::getFilename_abi_cxx11_((string *)local_1a8,pOVar8);
              softHSMLog(7,"index",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                         ,0x2ac,"(0x%08X) New object %s (0x%08X) added",this,local_1a8._0_8_,pOVar8)
              ;
              if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                operator_delete((void *)local_1a8._0_8_);
              }
              local_1a8._0_8_ = pOVar8;
              std::
              _Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
              ::_M_insert_unique<OSObject*>
                        ((_Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
                          *)local_188,(OSObject **)local_1a8);
              local_1a8._0_8_ = pOVar8;
              std::
              _Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
              ::_M_insert_unique<OSObject*>(local_f0,(OSObject **)local_1a8);
              if ((_Base_ptr *)local_180._M_impl._0_8_ !=
                  (_Base_ptr *)((long)&local_180._M_impl.super__Rb_tree_header._M_header + 8U)) {
                operator_delete((void *)local_180._M_impl._0_8_);
              }
            }
          }
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != &local_e8._M_impl.super__Rb_tree_header);
      }
      local_180._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_180._M_impl.super__Rb_tree_header._M_header;
      local_180._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_180._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_180._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var10 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_188 = &(this->objects)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_180._M_impl.super__Rb_tree_header._M_header._M_right =
           local_180._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var10 != local_188) {
        pOVar8 = (ObjectFile *)(local_1a8 + 0x10);
        do {
          lVar6 = *(long *)(p_Var10 + 1);
          if (lVar6 == 0) {
LAB_0016a30b:
            uVar7 = 0;
            softHSMLog(3,"index",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                       ,0x2b9,"Object type not compatible with this token class 0x%08X",lVar6);
            goto LAB_0016a336;
          }
          this_00 = (ObjectFile *)__dynamic_cast(lVar6,&OSObject::typeinfo,&ObjectFile::typeinfo,0);
          if (this_00 == (ObjectFile *)0x0) goto LAB_0016a30b;
          ObjectFile::getFilename_abi_cxx11_((string *)local_1a8,this_00);
          softHSMLog(7,"index",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x2be,"Processing %s (0x%08X)",local_1a8._0_8_,*(OSObject **)(p_Var10 + 1));
          if ((ObjectFile *)local_1a8._0_8_ != pOVar8) {
            operator_delete((void *)local_1a8._0_8_);
          }
          ObjectFile::getFilename_abi_cxx11_((string *)local_1a8,this_00);
          iVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_60,(string *)local_1a8);
          if ((ObjectFile *)local_1a8._0_8_ != pOVar8) {
            operator_delete((void *)local_1a8._0_8_);
          }
          if ((_Rb_tree_header *)iVar11._M_node == &local_60._M_impl.super__Rb_tree_header) {
            ObjectFile::getFilename_abi_cxx11_((string *)local_1a8,this_00);
            softHSMLog(7,"index",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                       ,0x2c2,"Adding object %s",local_1a8._0_8_);
            if ((ObjectFile *)local_1a8._0_8_ != pOVar8) {
              operator_delete((void *)local_1a8._0_8_);
            }
            std::
            _Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
            ::_M_insert_unique<OSObject*const&>
                      ((_Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
                        *)&local_180,(OSObject **)(p_Var10 + 1));
          }
          else {
            ObjectFile::invalidate(this_00);
          }
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while (p_Var10 != local_188);
      }
      std::
      _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
      ::operator=(&(this->objects)._M_t,&local_180);
      uVar7 = CONCAT71(uVar13,1);
      softHSMLog(7,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x2cf,"The token now contains %d objects",
                 (this->objects)._M_t._M_impl.super__Rb_tree_header._M_node_count);
LAB_0016a336:
      std::
      _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
      ::~_Rb_tree(&local_180);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_60);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_e8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b8);
    }
    else {
      softHSMLog(3,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x259,"Token integrity check failed");
      this->valid = false;
      uVar7 = 0;
    }
  }
  MutexLocker::~MutexLocker(&local_a0);
  return (char *)(uVar7 & 0xffffffff);
}

Assistant:

bool OSToken::index(bool isFirstTime /* = false */)
{
	// No access to object mutable fields before
	MutexLocker lock(tokenMutex);

	// Check if re-indexing is required
	if (!isFirstTime && (!valid || !gen->wasUpdated()))
	{
		DEBUG_MSG("No re-indexing is required");

		return true;
	}

	// Check the integrity
	if (!tokenDir->refresh() || !tokenObject->valid)
	{
		ERROR_MSG("Token integrity check failed");

		valid = false;

		return false;
	}

	DEBUG_MSG("Token %s has changed", tokenPath.c_str());

	// Retrieve the directory listing
	std::vector<std::string> tokenFiles = tokenDir->getFiles();

	// Filter out the objects
	std::set<std::string> newSet;

	for (std::vector<std::string>::iterator i = tokenFiles.begin(); i != tokenFiles.end(); i++)
	{
		if ((i->size() > 7) &&
		    (!(i->substr(i->size() - 7).compare(".object"))) &&
		    (i->compare("token.object")))
		{
			newSet.insert(*i);
		}
		else
		{
			DEBUG_MSG("Ignored file %s", i->c_str());
		}
	}

	// Compute the changes compared to the last list of files
	std::set<std::string> addedFiles;
	std::set<std::string> removedFiles;

	if (!isFirstTime)
	{
		// First compute which files were added
		for (std::set<std::string>::iterator i = newSet.begin(); i != newSet.end(); i++)
		{
			if (currentFiles.find(*i) == currentFiles.end())
			{
				addedFiles.insert(*i);
			}
		}

		// Now compute which files were removed
		for (std::set<std::string>::iterator i = currentFiles.begin(); i != currentFiles.end(); i++)
		{
			if (newSet.find(*i) == newSet.end())
			{
				removedFiles.insert(*i);
			}
		}
	}
	else
	{
		addedFiles = newSet;
	}

	currentFiles = newSet;

	DEBUG_MSG("%d objects were added and %d objects were removed", addedFiles.size(), removedFiles.size());
	DEBUG_MSG("Current directory set contains %d objects", currentFiles.size());

	// Now update the set of objects

	// Add new objects
	for (std::set<std::string>::iterator i = addedFiles.begin(); i != addedFiles.end(); i++)
	{
		if ((i->find_last_of('.') == std::string::npos) ||
		    (i->substr(i->find_last_of('.')) != ".object"))
		{
			continue;
		}

		std::string lockName(*i);
		lockName.replace(lockName.find_last_of('.'), std::string::npos, ".lock");

		// Create a new token object for the added file
		ObjectFile* newObject = new ObjectFile(this, tokenPath + OS_PATHSEP + *i, umask, tokenPath + OS_PATHSEP + lockName);

		// Add the object, even invalid ones.
		// This is so the we can read the attributes once
		// the other process has finished writing to disc.
		DEBUG_MSG("(0x%08X) New object %s (0x%08X) added", this, newObject->getFilename().c_str(), newObject);
		objects.insert(newObject);
		allObjects.insert(newObject);
	}

	// Remove deleted objects
	std::set<OSObject*> newObjects;

	for (std::set<OSObject*>::iterator i = objects.begin(); i != objects.end(); i++)
	{
		ObjectFile* fileObject = dynamic_cast<ObjectFile*>((*i));
		if (fileObject == NULL)
		{
			ERROR_MSG("Object type not compatible with this token class 0x%08X", (*i));

			return false;
		}

		DEBUG_MSG("Processing %s (0x%08X)", fileObject->getFilename().c_str(), *i);

		if (removedFiles.find(fileObject->getFilename()) == removedFiles.end())
		{
			DEBUG_MSG("Adding object %s", fileObject->getFilename().c_str());
			// This object gets to stay in the set
			newObjects.insert(*i);
		}
		else
		{
			fileObject->invalidate();
		}
	}

	// Set the new objects
	objects = newObjects;

	DEBUG_MSG("The token now contains %d objects", objects.size());

	return true;
}